

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_to_bip143_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,
                      size_t len,size_t *written)

{
  uchar *puVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  wally_tx_input *pwVar5;
  wally_tx_output *pwVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  leint32_t tmp;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  uint uVar16;
  long lVar17;
  undefined4 in_register_00000014;
  ulong uVar18;
  uint64_t *bytes_out_00;
  uint32_t *puVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong bytes_len;
  uint32_t *puVar24;
  uchar *puVar25;
  size_t is_elements;
  uchar buff [1024];
  char local_48c;
  uchar *local_488;
  uchar *local_478;
  ulong local_470;
  size_t local_458;
  uint32_t *local_450;
  uchar *local_448;
  size_t local_440;
  uchar local_438 [1032];
  
  puVar19 = (uint32_t *)CONCAT44(in_register_00000014,flags);
  local_458 = 0;
  uVar2 = opts->sighash;
  iVar10 = wally_tx_is_elements(tx,&local_458);
  if (iVar10 != 0) {
    return iVar10;
  }
  uVar16 = uVar2 & 0x1f;
  *puVar19 = tx->version;
  sVar11 = tx->num_inputs;
  local_450 = puVar19;
  local_448 = bytes_out;
  if (uVar16 == 2) {
LAB_001144eb:
    local_470 = 0;
    uVar20 = 0;
  }
  else if (uVar16 == 3) {
    uVar20 = opts->index;
    if (tx->num_outputs <= uVar20) goto LAB_001144eb;
    if (local_458 == 0) {
      uVar3 = tx->outputs[uVar20].script_len;
      sVar12 = varint_get_length(uVar3);
      uVar20 = uVar3 + sVar12 + 8;
    }
    else {
      sVar12 = confidential_asset_length_from_bytes(tx->outputs[uVar20].asset);
      sVar15 = confidential_value_length_from_bytes(tx->outputs[opts->index].value);
      sVar13 = confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce);
      uVar3 = tx->outputs[opts->index].script_len;
      sVar14 = varint_get_length(uVar3);
      uVar20 = sVar13 + uVar3 + sVar15 + sVar12 + sVar14;
      if ((uVar2 & 0x40) != 0) {
        uVar3 = tx->outputs[opts->index].rangeproof_len;
        sVar12 = varint_get_length(uVar3);
        uVar4 = tx->outputs[opts->index].surjectionproof_len;
        sVar15 = varint_get_length(uVar4);
        local_470 = uVar3 + uVar4 + sVar12 + sVar15;
        goto LAB_001144f6;
      }
    }
    local_470 = 0;
  }
  else {
    if (tx->num_outputs == 0) goto LAB_001144eb;
    lVar22 = 0;
    uVar21 = 0;
    uVar20 = 0;
    local_470 = 0;
    do {
      if (local_458 == 0) {
        lVar17 = 8;
      }
      else {
        sVar12 = confidential_asset_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->asset + lVar22));
        sVar15 = confidential_value_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->value + lVar22));
        sVar13 = confidential_nonce_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->nonce + lVar22));
        lVar17 = sVar13 + sVar15 + sVar12;
        if ((uVar2 & 0x40) != 0) {
          uVar3 = *(uint64_t *)((long)&tx->outputs->rangeproof_len + lVar22);
          sVar12 = varint_get_length(uVar3);
          uVar4 = *(uint64_t *)((long)&tx->outputs->surjectionproof_len + lVar22);
          sVar15 = varint_get_length(uVar4);
          local_470 = local_470 + uVar3 + sVar12 + sVar15 + uVar4;
        }
      }
      uVar3 = *(uint64_t *)((long)&tx->outputs->script_len + lVar22);
      sVar12 = varint_get_length(uVar3);
      uVar20 = uVar20 + lVar17 + uVar3 + sVar12;
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + 0x70;
    } while (uVar21 < tx->num_outputs);
  }
LAB_001144f6:
  uVar21 = sVar11 * 0x24;
  local_48c = (char)uVar2;
  if ((local_458 == 0 || local_48c < '\0') || (uVar18 = tx->num_inputs, uVar18 == 0)) {
    bytes_len = 0;
  }
  else {
    lVar22 = 0;
    uVar23 = 0;
    bytes_len = 0;
    do {
      lVar17 = 1;
      if ((tx->inputs->blinding_nonce[lVar22 + -1] & 2) != 0) {
        sVar11 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar22 + 0x27));
        sVar12 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar22 + 0x37));
        lVar17 = sVar11 + sVar12 + 0x40;
        uVar18 = tx->num_inputs;
      }
      bytes_len = bytes_len + lVar17;
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + 0xd0;
    } while (uVar23 < uVar18);
  }
  if ((((uVar21 < 0x401) && (uVar20 < 0x401)) && (local_470 < 0x401)) && (bytes_len < 0x401)) {
    local_478 = local_438;
    uVar18 = 0x400;
  }
  else {
    uVar18 = uVar20;
    if (uVar20 < uVar21) {
      uVar18 = uVar21;
    }
    if (uVar18 <= local_470) {
      uVar18 = local_470;
    }
    if (uVar18 <= bytes_len) {
      uVar18 = bytes_len;
    }
    local_478 = (uchar *)wally_malloc(uVar18);
    if (local_478 == (uchar *)0x0) {
      return -3;
    }
  }
  puVar24 = local_450;
  puVar19 = local_450 + 1;
  local_440 = uVar18;
  if (local_48c < '\0') {
    puVar24[5] = 0;
    puVar24[6] = 0;
    puVar24[7] = 0;
    puVar24[8] = 0;
    puVar19[0] = 0;
    puVar19[1] = 0;
    puVar24[3] = 0;
    puVar24[4] = 0;
LAB_0011463b:
    puVar24[0xd] = 0;
    puVar24[0xe] = 0;
    puVar24[0xf] = 0;
    puVar24[0x10] = 0;
    puVar24[9] = 0;
    puVar24[10] = 0;
    puVar24[0xb] = 0;
    puVar24[0xc] = 0;
  }
  else {
    if (tx->num_inputs != 0) {
      puVar25 = local_478 + 0x20;
      lVar22 = 0;
      uVar18 = 0;
      do {
        puVar1 = tx->inputs->txhash + lVar22;
        uVar7 = *(undefined8 *)puVar1;
        uVar8 = *(undefined8 *)(puVar1 + 8);
        puVar1 = tx->inputs->txhash + lVar22 + 0x10;
        uVar9 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)(puVar25 + -0x10) = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar25 + -8) = uVar9;
        *(undefined8 *)(puVar25 + -0x20) = uVar7;
        *(undefined8 *)(puVar25 + -0x18) = uVar8;
        *(undefined4 *)puVar25 = *(undefined4 *)(tx->inputs->txhash + lVar22 + 0x20);
        uVar18 = uVar18 + 1;
        lVar22 = lVar22 + 0xd0;
        puVar25 = puVar25 + 0x24;
      } while (uVar18 < tx->num_inputs);
    }
    iVar10 = wally_sha256d(local_478,uVar21,(uchar *)puVar19,0x20);
    if (iVar10 != 0) goto LAB_00114de1;
    if ((uVar2 & 0x1e) == 2) goto LAB_0011463b;
    if (tx->num_inputs == 0) {
      sVar11 = 0;
    }
    else {
      lVar22 = 9;
      uVar21 = 0;
      do {
        *(undefined4 *)(local_478 + uVar21 * 4) = *(undefined4 *)(tx->inputs->txhash + lVar22 * 4);
        uVar21 = uVar21 + 1;
        lVar22 = lVar22 + 0x34;
      } while (uVar21 < tx->num_inputs);
      sVar11 = tx->num_inputs << 2;
    }
    iVar10 = wally_sha256d(local_478,sVar11,(uchar *)(puVar24 + 9),0x20);
    if (iVar10 != 0) goto LAB_00114de1;
  }
  puVar19 = puVar24 + 0x11;
  if (local_458 != 0) {
    if (local_48c < '\0') {
      puVar24[0x15] = 0;
      puVar24[0x16] = 0;
      puVar24[0x17] = 0;
      puVar24[0x18] = 0;
      puVar19[0] = 0;
      puVar19[1] = 0;
      puVar24[0x13] = 0;
      puVar24[0x14] = 0;
    }
    else {
      if (tx->num_inputs != 0) {
        lVar22 = 0;
        uVar21 = 0;
        puVar25 = local_478;
        do {
          pwVar5 = tx->inputs;
          if ((pwVar5->blinding_nonce[lVar22 + -1] & 2) == 0) {
            *puVar25 = '\0';
            puVar25 = puVar25 + 1;
          }
          else {
            uVar7 = *(undefined8 *)(pwVar5->blinding_nonce + lVar22);
            uVar8 = *(undefined8 *)(pwVar5->blinding_nonce + lVar22 + 8);
            uVar9 = *(undefined8 *)(pwVar5->blinding_nonce + lVar22 + 0x10 + 8);
            *(undefined8 *)(puVar25 + 0x10) =
                 *(undefined8 *)(pwVar5->blinding_nonce + lVar22 + 0x10);
            *(undefined8 *)(puVar25 + 0x18) = uVar9;
            *(undefined8 *)puVar25 = uVar7;
            *(undefined8 *)(puVar25 + 8) = uVar8;
            puVar1 = tx->inputs->entropy + lVar22;
            uVar7 = *(undefined8 *)puVar1;
            uVar8 = *(undefined8 *)(puVar1 + 8);
            puVar1 = tx->inputs->entropy + lVar22 + 0x10;
            uVar9 = *(undefined8 *)(puVar1 + 8);
            *(undefined8 *)(puVar25 + 0x30) = *(undefined8 *)puVar1;
            *(undefined8 *)(puVar25 + 0x38) = uVar9;
            *(undefined8 *)(puVar25 + 0x20) = uVar7;
            *(undefined8 *)(puVar25 + 0x28) = uVar8;
            sVar11 = confidential_value_to_bytes
                               (*(uchar **)(tx->inputs->entropy + lVar22 + 0x27),
                                *(size_t *)(tx->inputs->entropy + lVar22 + 0x2f),puVar25 + 0x40);
            sVar12 = confidential_value_to_bytes
                               (*(uchar **)(tx->inputs->entropy + lVar22 + 0x37),
                                *(size_t *)(tx->inputs->entropy + lVar22 + 0x3f),
                                puVar25 + sVar11 + 0x40);
            puVar25 = puVar25 + sVar11 + 0x40 + sVar12;
          }
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0xd0;
        } while (uVar21 < tx->num_inputs);
      }
      iVar10 = wally_sha256d(local_478,bytes_len,(uchar *)puVar19,0x20);
      puVar24 = local_450;
      if (iVar10 != 0) goto LAB_00114de1;
    }
    puVar19 = puVar24 + 0x19;
  }
  pwVar5 = tx->inputs + opts->index;
  uVar7 = *(undefined8 *)pwVar5->txhash;
  uVar8 = *(undefined8 *)(pwVar5->txhash + 8);
  puVar25 = tx->inputs[opts->index].txhash + 0x10;
  uVar9 = *(undefined8 *)(puVar25 + 8);
  *(undefined8 *)(puVar19 + 4) = *(undefined8 *)puVar25;
  *(undefined8 *)(puVar19 + 6) = uVar9;
  *(undefined8 *)puVar19 = uVar7;
  *(undefined8 *)(puVar19 + 2) = uVar8;
  puVar19[8] = tx->inputs[opts->index].index;
  sVar11 = varbuff_to_bytes(opts->script,opts->script_len,(uchar *)(puVar19 + 9));
  bytes_out_00 = (uint64_t *)((long)puVar19 + sVar11 + 0x24);
  if (local_458 == 0) {
    *bytes_out_00 = opts->satoshi;
    *(uint32_t *)((long)puVar19 + sVar11 + 0x2c) = tx->inputs[opts->index].sequence;
    local_488 = (uchar *)((long)puVar19 + sVar11 + 0x30);
  }
  else {
    sVar12 = confidential_value_to_bytes(opts->value,opts->value_len,(uchar *)bytes_out_00);
    local_488 = (uchar *)((long)puVar19 + sVar12 + sVar11 + 0x28);
    *(uint32_t *)(local_488 + -4) = tx->inputs[opts->index].sequence;
    if (local_458 != 0) {
      pwVar5 = tx->inputs;
      sVar11 = opts->index;
      if ((pwVar5[sVar11].features & 2) != 0) {
        uVar7 = *(undefined8 *)pwVar5[sVar11].blinding_nonce;
        uVar8 = *(undefined8 *)(pwVar5[sVar11].blinding_nonce + 8);
        uVar9 = *(undefined8 *)(pwVar5[sVar11].blinding_nonce + 0x18);
        *(undefined8 *)(local_488 + 0x10) = *(undefined8 *)(pwVar5[sVar11].blinding_nonce + 0x10);
        *(undefined8 *)(local_488 + 0x18) = uVar9;
        *(undefined8 *)local_488 = uVar7;
        *(undefined8 *)(local_488 + 8) = uVar8;
        puVar25 = tx->inputs[opts->index].entropy;
        uVar7 = *(undefined8 *)puVar25;
        uVar8 = *(undefined8 *)(puVar25 + 8);
        puVar25 = tx->inputs[opts->index].entropy + 0x10;
        uVar9 = *(undefined8 *)(puVar25 + 8);
        *(undefined8 *)((long)bytes_out_00 + sVar12 + 0x34) = *(undefined8 *)puVar25;
        *(undefined8 *)((long)bytes_out_00 + sVar12 + 0x3c) = uVar9;
        *(undefined8 *)((long)bytes_out_00 + sVar12 + 0x24) = uVar7;
        *(undefined8 *)((long)bytes_out_00 + sVar12 + 0x2c) = uVar8;
        sVar11 = confidential_value_to_bytes
                           (tx->inputs[opts->index].issuance_amount,
                            tx->inputs[opts->index].issuance_amount_len,
                            (uchar *)((long)bytes_out_00 + sVar12 + 0x44));
        local_488 = (uchar *)((long)bytes_out_00 + sVar11 + sVar12 + 0x44);
        sVar11 = confidential_value_to_bytes
                           (tx->inputs[opts->index].inflation_keys,
                            tx->inputs[opts->index].inflation_keys_len,local_488);
        local_488 = local_488 + sVar11;
      }
    }
  }
  if (uVar16 == 2) {
LAB_00114b57:
    local_488[0x10] = '\0';
    local_488[0x11] = '\0';
    local_488[0x12] = '\0';
    local_488[0x13] = '\0';
    local_488[0x14] = '\0';
    local_488[0x15] = '\0';
    local_488[0x16] = '\0';
    local_488[0x17] = '\0';
    local_488[0x18] = '\0';
    local_488[0x19] = '\0';
    local_488[0x1a] = '\0';
    local_488[0x1b] = '\0';
    local_488[0x1c] = '\0';
    local_488[0x1d] = '\0';
    local_488[0x1e] = '\0';
    local_488[0x1f] = '\0';
    local_488[0] = '\0';
    local_488[1] = '\0';
    local_488[2] = '\0';
    local_488[3] = '\0';
    local_488[4] = '\0';
    local_488[5] = '\0';
    local_488[6] = '\0';
    local_488[7] = '\0';
    local_488[8] = '\0';
    local_488[9] = '\0';
    local_488[10] = '\0';
    local_488[0xb] = '\0';
    local_488[0xc] = '\0';
    local_488[0xd] = '\0';
    local_488[0xe] = '\0';
    local_488[0xf] = '\0';
  }
  else {
    if (uVar16 == 3) {
      uVar21 = tx->num_outputs;
      if (uVar21 <= opts->index) goto LAB_00114b57;
LAB_00114c06:
      lVar22 = 0;
      sVar11 = 0;
      puVar25 = local_478;
      do {
        if ((uVar16 != 3) || (sVar11 == opts->index)) {
          pwVar6 = tx->outputs;
          if (local_458 == 0) {
            *(undefined8 *)puVar25 = *(undefined8 *)((long)&pwVar6->satoshi + lVar22);
            puVar25 = puVar25 + 8;
          }
          else {
            sVar12 = confidential_value_to_bytes
                               (*(uchar **)((long)&pwVar6->asset + lVar22),
                                *(size_t *)((long)&pwVar6->asset_len + lVar22),puVar25);
            puVar25 = puVar25 + sVar12;
            sVar12 = confidential_value_to_bytes
                               (*(uchar **)((long)&tx->outputs->value + lVar22),
                                *(size_t *)((long)&tx->outputs->value_len + lVar22),puVar25);
            sVar15 = confidential_value_to_bytes
                               (*(uchar **)((long)&tx->outputs->nonce + lVar22),
                                *(size_t *)((long)&tx->outputs->nonce_len + lVar22),puVar25 + sVar12
                               );
            puVar25 = puVar25 + sVar12 + sVar15;
          }
          sVar12 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->script + lVar22),
                                    *(size_t *)((long)&tx->outputs->script_len + lVar22),puVar25);
          puVar25 = puVar25 + sVar12;
          uVar21 = tx->num_outputs;
        }
        sVar11 = sVar11 + 1;
        lVar22 = lVar22 + 0x70;
      } while (sVar11 < uVar21);
    }
    else {
      uVar21 = tx->num_outputs;
      if (uVar21 != 0) goto LAB_00114c06;
    }
    iVar10 = wally_sha256d(local_478,uVar20,local_488,0x20);
    if (iVar10 != 0) goto LAB_00114de1;
  }
  puVar19 = (uint32_t *)(local_488 + 0x20);
  if (local_458 != 0 && (uVar2 & 0x40) != 0) {
    if (uVar16 == 2) {
LAB_00114bb8:
      local_488[0x30] = '\0';
      local_488[0x31] = '\0';
      local_488[0x32] = '\0';
      local_488[0x33] = '\0';
      local_488[0x34] = '\0';
      local_488[0x35] = '\0';
      local_488[0x36] = '\0';
      local_488[0x37] = '\0';
      local_488[0x38] = '\0';
      local_488[0x39] = '\0';
      local_488[0x3a] = '\0';
      local_488[0x3b] = '\0';
      local_488[0x3c] = '\0';
      local_488[0x3d] = '\0';
      local_488[0x3e] = '\0';
      local_488[0x3f] = '\0';
      puVar19[0] = 0;
      puVar19[1] = 0;
      local_488[0x28] = '\0';
      local_488[0x29] = '\0';
      local_488[0x2a] = '\0';
      local_488[0x2b] = '\0';
      local_488[0x2c] = '\0';
      local_488[0x2d] = '\0';
      local_488[0x2e] = '\0';
      local_488[0x2f] = '\0';
    }
    else {
      if (uVar16 == 3) {
        uVar20 = tx->num_outputs;
        if (uVar20 <= opts->index) goto LAB_00114bb8;
LAB_00114d3e:
        lVar22 = 0;
        uVar21 = 0;
        puVar25 = local_478;
        do {
          if ((uVar16 != 3) || (uVar21 == opts->index)) {
            sVar11 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->rangeproof + lVar22),
                                      *(size_t *)((long)&tx->outputs->rangeproof_len + lVar22),
                                      puVar25);
            sVar12 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->surjectionproof + lVar22),
                                      *(size_t *)((long)&tx->outputs->surjectionproof_len + lVar22),
                                      puVar25 + sVar11);
            puVar25 = puVar25 + sVar11 + sVar12;
            uVar20 = tx->num_outputs;
          }
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x70;
        } while (uVar21 < uVar20);
      }
      else {
        uVar20 = tx->num_outputs;
        if (uVar20 != 0) goto LAB_00114d3e;
      }
      iVar10 = wally_sha256d(local_478,local_470,(uchar *)puVar19,0x20);
      if (iVar10 != 0) goto LAB_00114de1;
    }
    puVar19 = (uint32_t *)(local_488 + 0x40);
  }
  *puVar19 = tx->locktime;
  puVar19[1] = opts->tx_sighash;
  *(uchar **)local_448 = (uchar *)((long)puVar19 + (8 - (long)local_450));
  iVar10 = 0;
LAB_00114de1:
  if (local_478 == local_438) {
    wally_clear(local_438,0x400);
  }
  else {
    clear_and_free(local_478,local_440);
  }
  return iVar10;
}

Assistant:

static inline int tx_to_bip143_bytes(const struct wally_tx *tx,
                                     const struct tx_serialize_opts *opts,
                                     uint32_t flags,
                                     unsigned char *bytes_out, size_t len,
                                     size_t *written)
{
    unsigned char buff[TX_STACK_SIZE / 2], *buff_p = buff;
    size_t i, inputs_size, outputs_size, rangeproof_size = 0, issuances_size = 0, buff_len = sizeof(buff);
    size_t is_elements = 0;
    const bool anyonecanpay = opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out, *output_p;
    int ret = WALLY_OK;

    (void)flags;
    (void)len;

#ifdef BUILD_ELEMENTS
    if ((ret = wally_tx_is_elements(tx, &is_elements)) != WALLY_OK)
        return ret;
#endif

    /* Note we assume tx_to_bytes has already validated all inputs */
    p += uint32_to_le_bytes(tx->version, p);

    inputs_size = tx->num_inputs * (WALLY_TXHASH_LEN + sizeof(uint32_t));
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        outputs_size = 0;
    else if (sh_single) {
        if (!is_elements)
            outputs_size = sizeof(uint64_t) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);
#ifdef BUILD_ELEMENTS
        else {
            outputs_size = confidential_asset_length_from_bytes(tx->outputs[opts->index].asset) +
                           confidential_value_length_from_bytes(tx->outputs[opts->index].value) +
                           confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce) +
                           varbuff_get_length(tx->outputs[opts->index].script_len);

            if (sh_rangeproof) {
                rangeproof_size = varbuff_get_length(tx->outputs[opts->index].rangeproof_len) +
                                  varbuff_get_length(tx->outputs[opts->index].surjectionproof_len);
            }
        }
#else
        else
            return WALLY_EINVAL;
#endif
    } else {
        outputs_size = 0;
        rangeproof_size = 0;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (!is_elements)
                outputs_size += sizeof(uint64_t);
#ifdef BUILD_ELEMENTS
            else {
                outputs_size += confidential_asset_length_from_bytes(tx->outputs[i].asset) +
                                confidential_value_length_from_bytes(tx->outputs[i].value) +
                                confidential_nonce_length_from_bytes(tx->outputs[i].nonce);

                if (sh_rangeproof) {
                    rangeproof_size += varbuff_get_length(tx->outputs[i].rangeproof_len) +
                                       varbuff_get_length(tx->outputs[i].surjectionproof_len);
                }
            }
#else
            else
                return WALLY_EINVAL;
#endif
            outputs_size += varbuff_get_length(tx->outputs[i].script_len);
        }
    }

#ifdef BUILD_ELEMENTS
    if (is_elements && !anyonecanpay) {
        for (i = 0; i < tx->num_inputs; ++i) {
            if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE)
                issuances_size +=
                    2 * WALLY_TX_ASSET_TAG_LEN +
                    confidential_value_length_from_bytes(tx->inputs[i].issuance_amount) +
                    confidential_value_length_from_bytes(tx->inputs[i].inflation_keys);
            else
                issuances_size += 1;
        }
    }
#endif

    if (inputs_size > buff_len || outputs_size > buff_len ||
        rangeproof_size > buff_len || issuances_size > buff_len) {
        buff_len = inputs_size > outputs_size ? inputs_size : outputs_size;
        buff_len = buff_len > rangeproof_size ? buff_len : rangeproof_size;
        buff_len = buff_len > issuances_size ? buff_len : issuances_size;
        buff_p = wally_malloc(buff_len);
        if (buff_p == NULL)
            return WALLY_ENOMEM;
    }

    /* Inputs */
    if (anyonecanpay)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i) {
            unsigned char *tmp_p = buff_p + i * (WALLY_TXHASH_LEN + sizeof(uint32_t));
            memcpy(tmp_p, tx->inputs[i].txhash, WALLY_TXHASH_LEN);
            uint32_to_le_bytes(tx->inputs[i].index, tmp_p + WALLY_TXHASH_LEN);
        }

        if ((ret = wally_sha256d(buff_p, inputs_size, p, SHA256_LEN)) != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* Sequences */
    if (anyonecanpay || sh_single || sh_none)
        memset(p, 0, SHA256_LEN);
    else {
        for (i = 0; i < tx->num_inputs; ++i)
            uint32_to_le_bytes(tx->inputs[i].sequence, buff_p + i * sizeof(uint32_t));

        ret = wally_sha256d(buff_p, tx->num_inputs * sizeof(uint32_t), p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

#ifdef BUILD_ELEMENTS
    if (is_elements) {
        /* Issuance */
        if (anyonecanpay)
            memset(p, 0, SHA256_LEN);
        else {
            unsigned char *tmp_p = buff_p;
            for (i = 0; i < tx->num_inputs; ++i) {
                if (tx->inputs[i].features & WALLY_TX_IS_ISSUANCE) {
                    memcpy(tmp_p, tx->inputs[i].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    memcpy(tmp_p, tx->inputs[i].entropy, WALLY_TX_ASSET_TAG_LEN);
                    tmp_p += WALLY_TX_ASSET_TAG_LEN;
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].issuance_amount,
                                                         tx->inputs[i].issuance_amount_len, tmp_p);
                    tmp_p += confidential_value_to_bytes(tx->inputs[i].inflation_keys,
                                                         tx->inputs[i].inflation_keys_len, tmp_p);
                }
                else
                    *tmp_p++ = 0;
            }

            if ((ret = wally_sha256d(buff_p, issuances_size, p, SHA256_LEN)) != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif /* BUILD_ELEMENTS */

    /* Input details */
    memcpy(p, tx->inputs[opts->index].txhash, WALLY_TXHASH_LEN);
    p += WALLY_TXHASH_LEN;
    p += uint32_to_le_bytes(tx->inputs[opts->index].index, p);
    p += varbuff_to_bytes(opts->script, opts->script_len, p);
    if (!is_elements)
        p += uint64_to_le_bytes(opts->satoshi, p);
#ifdef BUILD_ELEMENTS
    else
        p += confidential_value_to_bytes(opts->value, opts->value_len, p);
#endif
    p += uint32_to_le_bytes(tx->inputs[opts->index].sequence, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)) {
        memcpy(p, tx->inputs[opts->index].blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        memcpy(p, tx->inputs[opts->index].entropy, WALLY_TX_ASSET_TAG_LEN);
        p += WALLY_TX_ASSET_TAG_LEN;
        p += confidential_value_to_bytes(tx->inputs[opts->index].issuance_amount,
                                         tx->inputs[opts->index].issuance_amount_len, p);
        p += confidential_value_to_bytes(tx->inputs[opts->index].inflation_keys,
                                         tx->inputs[opts->index].inflation_keys_len, p);
    }
#endif

    /* Outputs */
    if (sh_none || (sh_single && opts->index >= tx->num_outputs))
        memset(p, 0, SHA256_LEN);
    else {
        output_p = buff_p;
        for (i = 0; i < tx->num_outputs; ++i) {
            if (sh_single && i != opts->index)
                continue;
            if (!is_elements)
                output_p += uint64_to_le_bytes(tx->outputs[i].satoshi, output_p);
#ifdef BUILD_ELEMENTS
            else {
                output_p += confidential_value_to_bytes(tx->outputs[i].asset, tx->outputs[i].asset_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].value, tx->outputs[i].value_len,
                                                        output_p);
                output_p += confidential_value_to_bytes(tx->outputs[i].nonce, tx->outputs[i].nonce_len,
                                                        output_p);
            }
#endif
            output_p += varbuff_to_bytes(tx->outputs[i].script,
                                         tx->outputs[i].script_len, output_p);
        }

        ret = wally_sha256d(buff_p, outputs_size, p, SHA256_LEN);
        if (ret != WALLY_OK)
            goto error;
    }
    p += SHA256_LEN;

    /* rangeproof */
#ifdef BUILD_ELEMENTS
    if (is_elements && sh_rangeproof) {
        if (sh_none || (sh_single && opts->index >= tx->num_outputs))
            memset(p, 0, SHA256_LEN);
        else {
            output_p = buff_p;
            for (i = 0; i < tx->num_outputs; ++i) {
                if (sh_single && i != opts->index)
                    continue;
                output_p += varbuff_to_bytes(tx->outputs[i].rangeproof,
                                             tx->outputs[i].rangeproof_len, output_p);
                output_p += varbuff_to_bytes(tx->outputs[i].surjectionproof,
                                             tx->outputs[i].surjectionproof_len, output_p);
            }
            ret = wally_sha256d(buff_p, rangeproof_size, p, SHA256_LEN);
            if (ret != WALLY_OK)
                goto error;
        }
        p += SHA256_LEN;
    }
#endif

    /* nlocktime and sighash*/
    p += uint32_to_le_bytes(tx->locktime, p);
    p += uint32_to_le_bytes(opts->tx_sighash, p);

    *written = p - bytes_out;

error:
    if (buff_p != buff)
        clear_and_free(buff_p, buff_len);
    else
        wally_clear(buff, sizeof(buff));
    return ret;
}